

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int cuddEstimateCofactorSimple(DdNode *node,int i)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  do {
    iVar1 = 0;
    if (((ulong)node->next & 1) != 0) {
LAB_00808dc6:
      return iVar1 + iVar2;
    }
    node->next = (DdNode *)((ulong)node->next | 1);
    if (node->index == 0x7fffffff) {
      iVar1 = 1;
      goto LAB_00808dc6;
    }
    iVar1 = cuddEstimateCofactorSimple((node->type).kids.T,i);
    if (node->index == i) goto LAB_00808dc6;
    node = (DdNode *)((ulong)(node->type).kids.E & 0xfffffffffffffffe);
    iVar2 = iVar2 + iVar1 + 1;
  } while( true );
}

Assistant:

static int
cuddEstimateCofactorSimple(
  DdNode * node,
  int i)
{
    int tval, eval;

    if (Cudd_IsComplement(node->next)) {
        return(0);
    }
    node->next = Cudd_Not(node->next);
    if (cuddIsConstant(node)) {
        return(1);
    }
    tval = cuddEstimateCofactorSimple(cuddT(node),i);
    if ((int) node->index == i) return(tval);
    eval = cuddEstimateCofactorSimple(Cudd_Regular(cuddE(node)),i);
    return(1 + tval + eval);

}